

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O3

void __thiscall
icu_63::double_conversion::Bignum::SubtractTimes(Bignum *this,Bignum *other,int factor)

{
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  
  if (factor < 3) {
    if (0 < factor) {
      do {
        SubtractBignum(this,other);
        factor = factor + -1;
      } while (factor != 0);
    }
  }
  else {
    lVar5 = (long)other->exponent_ - (long)this->exponent_;
    iVar9 = other->used_digits_;
    if (iVar9 < 1) {
      uVar8 = 0;
    }
    else {
      puVar1 = (this->bigits_).start_;
      puVar2 = (other->bigits_).start_;
      lVar7 = 0;
      uVar8 = 0;
      do {
        uVar4 = (ulong)uVar8 + (ulong)puVar2[lVar7] * (ulong)(uint)factor;
        uVar8 = puVar1[lVar5 + lVar7] - ((uint)uVar4 & 0xfffffff);
        puVar1[lVar5 + lVar7] = uVar8 & 0xfffffff;
        uVar8 = (int)(uVar4 >> 0x1c) - ((int)uVar8 >> 0x1f);
        lVar7 = lVar7 + 1;
        iVar9 = other->used_digits_;
      } while (lVar7 < iVar9);
    }
    iVar9 = iVar9 + (int)lVar5;
    uVar6 = this->used_digits_;
    if (iVar9 < (int)uVar6) {
      puVar1 = (this->bigits_).start_;
      lVar5 = (long)iVar9;
      do {
        if (uVar8 == 0) {
          return;
        }
        uVar8 = puVar1[lVar5] - uVar8;
        puVar1[lVar5] = uVar8 & 0xfffffff;
        uVar8 = uVar8 >> 0x1f;
        lVar5 = lVar5 + 1;
        uVar6 = this->used_digits_;
      } while (lVar5 < (int)uVar6);
    }
    if ((int)uVar6 < 1) {
      if (uVar6 != 0) {
        return;
      }
    }
    else {
      puVar1 = (this->bigits_).start_;
      uVar4 = (ulong)uVar6;
      do {
        if (puVar1[uVar4 - 1] != 0) {
          return;
        }
        this->used_digits_ = (int)uVar4 + -1;
        bVar3 = 1 < uVar4;
        uVar4 = uVar4 - 1;
      } while (bVar3);
    }
    this->exponent_ = 0;
  }
  return;
}

Assistant:

void Bignum::SubtractTimes(const Bignum& other, int factor) {
  ASSERT(exponent_ <= other.exponent_);
  if (factor < 3) {
    for (int i = 0; i < factor; ++i) {
      SubtractBignum(other);
    }
    return;
  }
  Chunk borrow = 0;
  int exponent_diff = other.exponent_ - exponent_;
  for (int i = 0; i < other.used_digits_; ++i) {
    DoubleChunk product = static_cast<DoubleChunk>(factor) * other.bigits_[i];
    DoubleChunk remove = borrow + product;
    Chunk difference = bigits_[i + exponent_diff] - (remove & kBigitMask);
    bigits_[i + exponent_diff] = difference & kBigitMask;
    borrow = static_cast<Chunk>((difference >> (kChunkSize - 1)) +
                                (remove >> kBigitSize));
  }
  for (int i = other.used_digits_ + exponent_diff; i < used_digits_; ++i) {
    if (borrow == 0) return;
    Chunk difference = bigits_[i] - borrow;
    bigits_[i] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  Clamp();
}